

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_6acc::TENSOR_INDEXING_Test::TestBody(TENSOR_INDEXING_Test *this)

{
  array<unsigned_int,_3UL> size;
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  AssertHelper local_158;
  Message local_150;
  int local_148;
  array<unsigned_int,_3UL> local_144;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_3;
  Message local_120;
  int local_118;
  array<unsigned_int,_3UL> local_114;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  array<unsigned_int,_3UL> local_ec;
  AssertHelper local_e0;
  Message local_d8;
  int local_d0;
  array<unsigned_int,_3UL> local_cc;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  int local_a0 [5];
  array<unsigned_int,_3UL> local_8c;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  int local_54;
  undefined1 local_50 [8];
  tensor<int,_3U> ts;
  TENSOR_INDEXING_Test *this_local;
  
  local_54 = 0;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000003;
  size._M_elems[2] = 5;
  size._M_elems[0] = 3;
  size._M_elems[1] = 4;
  ts._56_8_ = this;
  dnet::data_types::tensor<int,_3U>::tensor((tensor<int,_3U> *)local_50,&local_54,size);
  local_8c._M_elems[0] = 1;
  local_8c._M_elems[1] = 2;
  local_8c._M_elems[2] = 3;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]((tensor<int,_3U> *)local_50,&local_8c);
  local_a0[0] = 0;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_80,"(ts[{1,2,3}])","0",piVar2,local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x49,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_cc._M_elems[0] = 2;
  local_cc._M_elems[1] = 3;
  local_cc._M_elems[2] = 4;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]((tensor<int,_3U> *)local_50,&local_cc);
  local_d0 = 0;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_c0,"(ts[{2,3,4}])","0",piVar2,&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x4a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_ec._M_elems[0] = 1;
  local_ec._M_elems[1] = 2;
  local_ec._M_elems[2] = 3;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]((tensor<int,_3U> *)local_50,&local_ec);
  *piVar2 = 1;
  gtest_ar_2.message_.ptr_._0_4_ = 2;
  gtest_ar_2.message_.ptr_._4_4_ = 3;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]
                     ((tensor<int,_3U> *)local_50,(array<unsigned_int,_3UL> *)&gtest_ar_2.message_);
  *piVar2 = 2;
  local_114._M_elems[0] = 1;
  local_114._M_elems[1] = 2;
  local_114._M_elems[2] = 3;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]((tensor<int,_3U> *)local_50,&local_114);
  local_118 = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_108,"(ts[{1,2,3}])","1",piVar2,&local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_144._M_elems[0] = 2;
  local_144._M_elems[1] = 3;
  local_144._M_elems[2] = 4;
  piVar2 = dnet::data_types::tensor<int,_3U>::operator[]((tensor<int,_3U> *)local_50,&local_144);
  local_148 = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_138,"(ts[{2,3,4}])","2",piVar2,&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x4e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  dnet::data_types::tensor<int,_3U>::~tensor((tensor<int,_3U> *)local_50);
  return;
}

Assistant:

TEST(TENSOR, INDEXING) {
        tensor<int, 3> ts(0, {3,4,5});
        EXPECT_EQ((ts[{1,2,3}]), 0);
        EXPECT_EQ((ts[{2,3,4}]), 0);
        ts[{1,2,3}] = 1;
        ts[{2,3,4}] = 2;
        EXPECT_EQ((ts[{1,2,3}]), 1);
        EXPECT_EQ((ts[{2,3,4}]), 2);
    }